

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdUnblindIssuance(void *handle,char *tx_hex_string,uint32_t tx_in_index,
                      char *asset_blinding_key,char *token_blinding_key,char **asset,
                      int64_t *asset_value,char **asset_blind_factor,char **asset_value_blind_factor
                      ,char **token,int64_t *token_value,char **token_blind_factor,
                      char **token_value_blind_factor)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  int64_t iVar4;
  char *in_RCX;
  char *in_RSI;
  char *in_R8;
  undefined8 *in_R9;
  Amount AVar5;
  int64_t *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  int64_t *in_stack_00000028;
  undefined8 *in_stack_00000030;
  undefined8 *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  UnblindParameter unblind_token;
  UnblindParameter unblind_asset;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> unblind_datas;
  Privkey token_key;
  Privkey asset_key;
  ConfidentialTransactionController ctxc;
  char *work_token_value_blind_factor;
  char *work_token_blind_factor;
  char *work_token;
  char *work_asset_value_blind_factor;
  char *work_asset_blind_factor;
  char *work_asset;
  UnblindParameter *in_stack_fffffffffffffad8;
  UnblindParameter *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  ConfidentialTransactionController *in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffaf8;
  CfdError error_code;
  UnblindParameter *in_stack_fffffffffffffb00;
  Privkey *in_stack_fffffffffffffb30;
  Privkey *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  uint32_t in_stack_fffffffffffffb44;
  ConfidentialTransactionController *in_stack_fffffffffffffb48;
  string local_438;
  string local_418;
  int64_t local_3f8;
  undefined1 local_3f0;
  Amount local_3e8;
  string local_3d8;
  string local_3b8;
  string local_398;
  int64_t local_378;
  undefined1 local_370;
  Amount local_368;
  string local_358;
  ConfidentialAssetId local_338;
  BlindFactor local_310;
  BlindFactor local_2f0;
  ConfidentialValue local_2d0;
  ConfidentialAssetId local_2a8;
  BlindFactor local_280;
  BlindFactor local_260;
  ConfidentialValue local_240;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_218;
  allocator local_1f9;
  string local_1f8;
  Privkey local_1d8;
  allocator local_1b1;
  string local_1b0;
  Privkey local_190;
  Privkey local_170;
  Privkey local_150;
  allocator local_129;
  string local_128 [118];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  ConfidentialTransactionController *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined8 *local_38;
  char *local_30;
  char *local_28;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (ConfidentialTransactionController *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x7d8;
    local_90.funcname = "CfdUnblindIssuance";
    cfd::core::logger::warn<>(&local_90,"tx is null or empty.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. tx is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffb00,error_code,
               (string *)in_stack_fffffffffffffaf0);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,local_18,&local_129);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  cfd::core::Privkey::Privkey(&local_150);
  cfd::core::Privkey::Privkey(&local_170);
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,local_28,&local_1b1);
    cfd::core::Privkey::Privkey(&local_190,&local_1b0,kMainnet,true);
    cfd::core::Privkey::operator=
              ((Privkey *)in_stack_fffffffffffffae0,(Privkey *)in_stack_fffffffffffffad8);
    cfd::core::Privkey::~Privkey((Privkey *)0x5b76a9);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,local_30,&local_1f9);
    cfd::core::Privkey::Privkey(&local_1d8,&local_1f8,kMainnet,true);
    cfd::core::Privkey::operator=
              ((Privkey *)in_stack_fffffffffffffae0,(Privkey *)in_stack_fffffffffffffad8);
    cfd::core::Privkey::~Privkey((Privkey *)0x5b7850);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  cfd::ConfidentialTransactionController::UnblindIssuance
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30);
  cfd::core::UnblindParameter::UnblindParameter(in_stack_fffffffffffffb00);
  cfd::core::UnblindParameter::UnblindParameter(in_stack_fffffffffffffb00);
  sVar3 = std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
          size(&local_218);
  if (sVar3 == 2) {
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    operator[](&local_218,0);
    cfd::core::UnblindParameter::operator=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    operator[](&local_218,1);
    cfd::core::UnblindParameter::operator=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  }
  bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&local_2a8);
  if (!bVar1) {
    if (local_38 != (undefined8 *)0x0) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_358,&local_2a8);
      local_40 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      std::__cxx11::string::~string((string *)&local_358);
    }
    if (in_stack_00000008 != (int64_t *)0x0) {
      AVar5 = cfd::core::ConfidentialValue::GetAmount(&local_240);
      local_378 = AVar5.amount_;
      local_370 = AVar5.ignore_check_;
      in_stack_fffffffffffffb44 = CONCAT13(local_370,(int3)in_stack_fffffffffffffb44);
      local_368.amount_ = local_378;
      local_368.ignore_check_ = (bool)local_370;
      iVar4 = cfd::core::Amount::GetSatoshiValue(&local_368);
      *in_stack_00000008 = iVar4;
    }
    if (in_stack_00000010 != (undefined8 *)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_398,&local_280);
      local_48 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      std::__cxx11::string::~string((string *)&local_398);
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_3b8,&local_260);
      local_50 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      std::__cxx11::string::~string((string *)&local_3b8);
    }
  }
  bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&local_338);
  if (!bVar1) {
    if (in_stack_00000020 != (undefined8 *)0x0) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3d8,&local_338);
      local_58 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      std::__cxx11::string::~string((string *)&local_3d8);
    }
    if (in_stack_00000028 != (int64_t *)0x0) {
      AVar5 = cfd::core::ConfidentialValue::GetAmount(&local_2d0);
      local_3f8 = AVar5.amount_;
      local_3f0 = AVar5.ignore_check_;
      local_3e8.amount_ = local_3f8;
      local_3e8.ignore_check_ = (bool)local_3f0;
      iVar4 = cfd::core::Amount::GetSatoshiValue(&local_3e8);
      *in_stack_00000028 = iVar4;
    }
    if (in_stack_00000030 != (undefined8 *)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_418,&local_310);
      local_60 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      std::__cxx11::string::~string((string *)&local_418);
    }
    if (in_stack_00000038 != (undefined8 *)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_438,&local_2f0);
      in_stack_fffffffffffffaf0 =
           (ConfidentialTransactionController *)
           cfd::capi::CreateString
                     ((string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      local_68 = in_stack_fffffffffffffaf0;
      std::__cxx11::string::~string((string *)&local_438);
    }
  }
  if (local_40 != (char *)0x0) {
    *local_38 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *in_stack_00000010 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *in_stack_00000018 = local_50;
  }
  if (local_58 != (char *)0x0) {
    *in_stack_00000020 = local_58;
  }
  if (local_60 != (char *)0x0) {
    *in_stack_00000030 = local_60;
  }
  if (local_68 != (ConfidentialTransactionController *)0x0) {
    *in_stack_00000038 = local_68;
  }
  local_4 = 0;
  cfd::core::UnblindParameter::~UnblindParameter(in_stack_fffffffffffffae0);
  cfd::core::UnblindParameter::~UnblindParameter(in_stack_fffffffffffffae0);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             in_stack_fffffffffffffaf0);
  cfd::core::Privkey::~Privkey((Privkey *)0x5b7eb5);
  cfd::core::Privkey::~Privkey((Privkey *)0x5b7ec2);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffffae0);
  return local_4;
}

Assistant:

int CfdUnblindIssuance(
    void* handle, const char* tx_hex_string, uint32_t tx_in_index,
    const char* asset_blinding_key, const char* token_blinding_key,
    char** asset, int64_t* asset_value, char** asset_blind_factor,
    char** asset_value_blind_factor, char** token, int64_t* token_value,
    char** token_blind_factor, char** token_value_blind_factor) {
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_asset_value_blind_factor = nullptr;
  char* work_token = nullptr;
  char* work_token_blind_factor = nullptr;
  char* work_token_value_blind_factor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    Privkey asset_key;
    Privkey token_key;
    if (!IsEmptyString(asset_blinding_key)) {
      asset_key = Privkey(asset_blinding_key);
    }
    if (!IsEmptyString(token_blinding_key)) {
      token_key = Privkey(token_blinding_key);
    }

    std::vector<UnblindParameter> unblind_datas =
        ctxc.UnblindIssuance(tx_in_index, asset_key, token_key);

    UnblindParameter unblind_asset;
    UnblindParameter unblind_token;
    if (unblind_datas.size() == 2) {  // 2固定
      unblind_asset = unblind_datas[0];
      unblind_token = unblind_datas[1];
    }

    if (!unblind_asset.asset.IsEmpty()) {
      if (asset != nullptr) {
        work_asset = CreateString(unblind_asset.asset.GetHex());
      }
      if (asset_value != nullptr) {
        *asset_value = unblind_asset.value.GetAmount().GetSatoshiValue();
      }
      if (asset_blind_factor != nullptr) {
        work_asset_blind_factor = CreateString(unblind_asset.abf.GetHex());
      }
      if (asset_value_blind_factor != nullptr) {
        work_asset_value_blind_factor =
            CreateString(unblind_asset.vbf.GetHex());
      }
    }
    if (!unblind_token.asset.IsEmpty()) {
      if (token != nullptr) {
        work_token = CreateString(unblind_token.asset.GetHex());
      }
      if (token_value != nullptr) {
        *token_value = unblind_token.value.GetAmount().GetSatoshiValue();
      }
      if (token_blind_factor != nullptr) {
        work_token_blind_factor = CreateString(unblind_token.abf.GetHex());
      }
      if (token_value_blind_factor != nullptr) {
        work_token_value_blind_factor =
            CreateString(unblind_token.vbf.GetHex());
      }
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_asset_value_blind_factor != nullptr)
      *asset_value_blind_factor = work_asset_value_blind_factor;
    if (work_token != nullptr) *token = work_token;
    if (work_token_blind_factor != nullptr)
      *token_blind_factor = work_token_blind_factor;
    if (work_token_value_blind_factor != nullptr)
      *token_value_blind_factor = work_token_value_blind_factor;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}